

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsread.c
# Opt level: O0

phits_file_t phits_open_internal(char *filename)

{
  int iVar1;
  phits_fileinternal_t *ppVar2;
  FILE *__stream;
  undefined8 in_RDI;
  phits_fileinternal_t *f;
  phits_file_t out;
  undefined4 local_30;
  int in_stack_ffffffffffffffd4;
  phits_fileinternal_t *in_stack_ffffffffffffffd8;
  undefined8 local_20;
  int reclen;
  phits_fileinternal_t *f_00;
  
  ppVar2 = (phits_fileinternal_t *)calloc(1,0x110);
  if (ppVar2 == (phits_fileinternal_t *)0x0) {
    phits_error((char *)0x1029f1);
  }
  ppVar2->particlesize = 0;
  ppVar2->lbuf = 0;
  ppVar2->reclen = 4;
  ppVar2->haspolarisation = 0;
  f_00 = ppVar2;
  memset(&ppVar2->part,0,0x70);
  mcpl_generic_fopen(&local_30,in_RDI);
  reclen = (int)((ulong)in_RDI >> 0x20);
  (ppVar2->filehandle).internal = (void *)CONCAT44(in_stack_ffffffffffffffd4,local_30);
  (ppVar2->filehandle).current_pos = (uint64_t)in_stack_ffffffffffffffd8;
  *(undefined8 *)&(ppVar2->filehandle).mode = local_20;
  iVar1 = phits_ensure_load(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  if (iVar1 == 0) {
    ppVar2->particlesize = 0;
    ppVar2->haspolarisation = 0;
  }
  else {
    iVar1 = phits_tryload_reclen(f_00,reclen);
    if ((iVar1 == 0) && (iVar1 = phits_tryload_reclen(f_00,reclen), iVar1 == 0)) {
      if (ppVar2->lbuf < 8) {
        phits_error((char *)0x102afb);
      }
      phits_error((char *)0x102b07);
    }
    if (ppVar2->reclen == 8) {
      __stream = (FILE *)phits_stdout();
      fprintf(__stream,
              "phits_open_file WARNING: 64bit Fortran records detected which is untested (feedback appreciated at https://mctools.github.io/mcpl/contact/).\n"
             );
    }
    if (ppVar2->particlesize == 0x50) {
      ppVar2->haspolarisation = 0;
    }
    else if (ppVar2->particlesize == 0x68) {
      ppVar2->haspolarisation = 1;
    }
    else {
      phits_error((char *)0x102b7d);
    }
  }
  return (phits_file_t)f_00;
}

Assistant:

phits_file_t phits_open_internal( const char * filename )
{
  phits_fileinternal_t * f = (phits_fileinternal_t*)calloc(1,sizeof(phits_fileinternal_t));
  if (!f)
    phits_error("memory allocation failure");

  phits_file_t out;
  out.internal = f;

  //Init:
  f->particlesize = 0;
  f->lbuf = 0;
  f->reclen = 4;
  f->haspolarisation = 0;
  memset( &( f->part ),0,sizeof(f->part) );

  //open file (supports gzipped if ends with .gz):
  f->filehandle = mcpl_generic_fopen( filename );

  //Try to read first Fortran record marker, keeping in mind that we do not
  //know if it is 32bit or 64bit, and that an empty file is to be interpreted
  //as a valid PHITS dump file with 0 particles:

  if (!phits_ensure_load(f,1)) {
    //Can't read a single byte. Assume that this indicates an empty file and
    //therefore a valid PHITS dump file with 0 particles:
    //file with 0 particles, mark as EOF:
    f->particlesize = 0;
    f->haspolarisation = 0;//Convention: We mark empty files as NOT HAVING
    //polarisation info (to avoid potentially inflating
    //mcpl files in various merge/conversion
    //scenarios).
    return out;
  }

  //Try to read first record with first 32bit then 64bit record lengths
  //(updating f->reclen and f->particlesize in case of success):
  if (!phits_tryload_reclen(f,4)) {
    if (!phits_tryload_reclen(f,8)) {
      if (f->lbuf<8)
        phits_error("Invalid PHITS dump file: too short\n");
      phits_error("Invalid PHITS dump file: Problems reading first record.\n");
    }
  }
  assert( f->reclen==4 || f->reclen==8 );

  if (f->reclen==8) {
    fprintf(phits_stdout(),"phits_open_file WARNING: 64bit Fortran records"
            " detected which is untested (feedback"
            " appreciated at https://mctools.github.io/mcpl/contact/).\n");
  }

  if (f->particlesize == 10*sizeof(double)) {
    f->haspolarisation = 0;
  } else if (f->particlesize == 13*sizeof(double)) {
    f->haspolarisation = 1;
  } else {
    phits_error("Invalid PHITS dump file: Does not contain exactly 10 or 13 fields in each"
                " particle - like due to unsupported configuration flags being used when"
                " producing the file.\n");
  }

  return out;
}